

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_SubD::VertexHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubD *this,ON_SubDHashType hash_type)

{
  ON_SubDHashType hash_type_00;
  uint level_index;
  ON_SubDVertex *first_vertex;
  undefined1 local_40 [8];
  ON_SubDVertexIdIterator vidit;
  ON_SubDHashType hash_type_local;
  ON_SubD *this_local;
  
  vidit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = hash_type;
  ON_SubDVertexIdIterator::ON_SubDVertexIdIterator((ON_SubDVertexIdIterator *)local_40,this);
  hash_type_00 = vidit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._7_1_;
  first_vertex = FirstVertex(this);
  level_index = ActiveLevelIndex(this);
  Internal_VertexHash(__return_storage_ptr__,hash_type_00,first_vertex,level_index,
                      (ON_SubDVertexIdIterator *)local_40);
  ON_SubDVertexIdIterator::~ON_SubDVertexIdIterator((ON_SubDVertexIdIterator *)local_40);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubD::VertexHash(ON_SubDHashType hash_type) const
{
  ON_SubDVertexIdIterator vidit(*this);
  return Internal_VertexHash(hash_type, FirstVertex(), this->ActiveLevelIndex(), vidit);
}